

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

uint8_t * __thiscall
cdns_qr_extended::parse_map_item
          (cdns_qr_extended *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  uint8_t *puVar1;
  
  switch(val) {
  case 0:
    break;
  case 1:
    this = (cdns_qr_extended *)&this->answer_index;
    break;
  case 2:
    this = (cdns_qr_extended *)&this->authority_index;
    break;
  case 3:
    this = (cdns_qr_extended *)&this->additional_index;
    break;
  default:
    puVar1 = cbor_skip(in,in_max,err);
    return puVar1;
  }
  puVar1 = cbor_parse_int(in,in_max,&this->question_index,0,err);
  return puVar1;
}

Assistant:

uint8_t* cdns_qr_extended::parse_map_item(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    switch (val) {
    case 0: // question_index
        in = cbor_parse_int(in, in_max, &question_index, 0, err);
        break;
    case 1: // answer_index
        in = cbor_parse_int(in, in_max, &answer_index, 0, err);
        break;
    case 2: // authority_index
        in = cbor_parse_int(in, in_max, &authority_index, 0, err);
        break;
    case 3: // additional_index
        in = cbor_parse_int(in, in_max, &additional_index, 0, err);
        break;
    default:
        /* TODO: something */
        in = cbor_skip(in, in_max, err);
        break;
    }
    return in;
}